

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

void __thiscall
unodb::detail::
basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
::delete_db_node_ptr_at_scope_exit::~delete_db_node_ptr_at_scope_exit
          (delete_db_node_ptr_at_scope_exit *this)

{
  delete_db_node_ptr_at_scope_exit *this_00;
  db_type *pdVar1;
  undefined1 local_20 [8];
  basic_db_leaf_unique_ptr<key_type,_value_type,_header_type,_unodb::db> r;
  
  this_00 = (delete_db_node_ptr_at_scope_exit *)(this->node_ptr).tagged_ptr;
  switch((uint)this_00 & 7) {
  case 0:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )((ulong)this_00 & 0xfffffffffffffff8);
    local_20 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_20);
    break;
  case 1:
    if ((void *)((ulong)this_00 & 0xfffffffffffffff8) != (void *)0x0) {
      pdVar1 = this->db;
      free((void *)((ulong)this_00 & 0xfffffffffffffff8));
      db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
      decrement_inode_count<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)pdVar1);
      return;
    }
    break;
  case 2:
    if ((void *)((ulong)this_00 & 0xfffffffffffffff8) != (void *)0x0) {
      pdVar1 = this->db;
      free((void *)((ulong)this_00 & 0xfffffffffffffff8));
      db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
      decrement_inode_count<unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)pdVar1);
      return;
    }
    break;
  case 3:
    if ((void *)((ulong)this_00 & 0xfffffffffffffff8) != (void *)0x0) {
      pdVar1 = this->db;
      free((void *)((ulong)this_00 & 0xfffffffffffffff8));
      db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
      decrement_inode_count<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)pdVar1);
      return;
    }
    break;
  case 4:
    if ((void *)((ulong)this_00 & 0xfffffffffffffff8) != (void *)0x0) {
      pdVar1 = this->db;
      free((void *)((ulong)this_00 & 0xfffffffffffffff8));
      db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
      decrement_inode_count<unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)pdVar1);
      return;
    }
    break;
  default:
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
    ::delete_db_node_ptr_at_scope_exit::~delete_db_node_ptr_at_scope_exit(this_00);
  }
  return;
}

Assistant:

~delete_db_node_ptr_at_scope_exit() noexcept {
      switch (node_ptr.type()) {
        case node_type::LEAF: {
          const auto r{
              make_db_leaf_ptr(node_ptr.template ptr<leaf_type *>(), db)};
          return;
        }
        case node_type::I4: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode4_type *>(), db)};
          return;
        }
        case node_type::I16: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode16_type *>(), db)};
          return;
        }
        case node_type::I48: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode48_type *>(), db)};
          return;
        }
        case node_type::I256: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode256_type *>(), db)};
          return;
        }
      }
      UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
    }